

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O0

void __thiscall iutest::TempFile::TempFile(TempFile *this)

{
  TempFile *this_local;
  
  IFile::IFile(&this->super_IFile);
  (this->super_IFile).super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__TempFile_00169218;
  (this->super_IFile).super_IInStream._vptr_IInStream = (_func_int **)&PTR__TempFile_00169268;
  StdioFile::StdioFile(&this->m_file);
  this->m_fd = -1;
  std::__cxx11::string::string((string *)&this->m_filename);
  return;
}

Assistant:

TempFile() IUTEST_CXX_NOEXCEPT_SPEC
        : m_fd(-1)
    {
    }